

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O1

void __thiscall
duckdb::AlpRDCompressionState<float>::AlpRDCompressionState
          (AlpRDCompressionState<float> *this,ColumnDataCheckpointData *checkpoint_data,
          AlpRDAnalyzeState<float> *analyze_state)

{
  byte bVar1;
  CompressionFunction *pCVar2;
  RowGroup *pRVar3;
  
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__CompressionState_024b2210;
  (this->super_CompressionState).info.block_manager =
       (analyze_state->super_AnalyzeState).info.block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__AlpRDCompressionState_024b3bf0;
  this->checkpoint_data = checkpoint_data;
  pCVar2 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_ALPRD);
  this->function = pCVar2;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  (this->state).right_bit_width = '\0';
  (this->state).left_bit_width = '\0';
  (this->state).exceptions_count = 0;
  this->vector_idx = 0;
  this->nulls_idx = 0;
  this->vectors_flushed = 0;
  this->data_bytes_used = 0;
  (this->state).left_parts_dict_map._M_h._M_buckets =
       &(this->state).left_parts_dict_map._M_h._M_single_bucket;
  (this->state).left_parts_dict_map._M_h._M_bucket_count = 1;
  (this->state).left_parts_dict_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->state).left_parts_dict_map._M_h._M_element_count = 0;
  (this->state).left_parts_dict_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->state).left_parts_dict_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->state).left_parts_dict_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->state).left_parts_dict_map._M_h,
                   &(analyze_state->state).left_parts_dict_map);
  (this->state).left_bit_width = (analyze_state->state).left_bit_width;
  (this->state).right_bit_width = (analyze_state->state).right_bit_width;
  bVar1 = (analyze_state->state).actual_dictionary_size;
  (this->state).actual_dictionary_size = bVar1;
  this->actual_dictionary_size_bytes = (uint)bVar1 + (uint)bVar1;
  this->next_vector_byte_index_start = (uint)bVar1 * 2 + 7;
  switchD_012e1ce8::default
            ((this->state).left_parts_dict,(analyze_state->state).left_parts_dict,
             (ulong)((uint)bVar1 + (uint)bVar1));
  pRVar3 = ColumnDataCheckpointData::GetRowGroup(checkpoint_data);
  CreateEmptySegment(this,(pRVar3->super_SegmentBase<duckdb::RowGroup>).start);
  return;
}

Assistant:

AlpRDCompressionState(ColumnDataCheckpointData &checkpoint_data, AlpRDAnalyzeState<T> *analyze_state)
	    : CompressionState(analyze_state->info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ALPRD)) {
		//! State variables from the analyze step that are needed for compression
		state.left_parts_dict_map = std::move(analyze_state->state.left_parts_dict_map);
		state.left_bit_width = analyze_state->state.left_bit_width;
		state.right_bit_width = analyze_state->state.right_bit_width;
		state.actual_dictionary_size = analyze_state->state.actual_dictionary_size;
		actual_dictionary_size_bytes = state.actual_dictionary_size * AlpRDConstants::DICTIONARY_ELEMENT_SIZE;
		next_vector_byte_index_start = AlpRDConstants::HEADER_SIZE + actual_dictionary_size_bytes;
		memcpy((void *)state.left_parts_dict, (void *)analyze_state->state.left_parts_dict,
		       actual_dictionary_size_bytes);
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);
	}